

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml2-py.c
# Opt level: O0

PyObject * libxml_xmlValidateOneElement(PyObject *self,PyObject *args)

{
  int iVar1;
  PyObject *local_78;
  PyObject *local_70;
  PyObject *local_68;
  undefined *local_60;
  PyObject *pyobj_elem;
  xmlNodePtr elem;
  PyObject *pyobj_doc;
  xmlDocPtr doc;
  PyObject *pyobj_ctxt;
  xmlValidCtxtPtr ctxt;
  int c_retval;
  PyObject *py_retval;
  PyObject *args_local;
  PyObject *self_local;
  
  py_retval = args;
  args_local = self;
  iVar1 = libxml_deprecationWarning("xmlValidateOneElement");
  if (iVar1 == -1) {
    self_local = (PyObject *)0x0;
  }
  else {
    iVar1 = _PyArg_ParseTuple_SizeT(py_retval,"OOO:xmlValidateOneElement",&doc,&elem,&local_60);
    if (iVar1 == 0) {
      self_local = (PyObject *)0x0;
    }
    else {
      if (doc == (xmlDocPtr)&_Py_NoneStruct) {
        local_68 = (PyObject *)0x0;
      }
      else {
        local_68 = (PyObject *)doc->name;
      }
      pyobj_ctxt = local_68;
      if (elem == (xmlNodePtr)&_Py_NoneStruct) {
        local_70 = (PyObject *)0x0;
      }
      else {
        local_70 = (PyObject *)elem->name;
      }
      pyobj_doc = local_70;
      if (local_60 == &_Py_NoneStruct) {
        local_78 = (PyObject *)0x0;
      }
      else {
        local_78 = *(PyObject **)(local_60 + 0x10);
      }
      pyobj_elem = local_78;
      ctxt._4_4_ = xmlValidateOneElement(local_68,local_70,local_78);
      self_local = libxml_intWrap(ctxt._4_4_);
    }
  }
  return self_local;
}

Assistant:

XML_IGNORE_DEPRECATION_WARNINGS
PyObject *
libxml_xmlValidateOneElement(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    PyObject *py_retval;
    int c_retval;
    xmlValidCtxtPtr ctxt;
    PyObject *pyobj_ctxt;
    xmlDocPtr doc;
    PyObject *pyobj_doc;
    xmlNodePtr elem;
    PyObject *pyobj_elem;

    if (libxml_deprecationWarning("xmlValidateOneElement") == -1)
        return(NULL);

    if (!PyArg_ParseTuple(args, (char *)"OOO:xmlValidateOneElement", &pyobj_ctxt, &pyobj_doc, &pyobj_elem))
        return(NULL);
    ctxt = (xmlValidCtxtPtr) PyValidCtxt_Get(pyobj_ctxt);
    doc = (xmlDocPtr) PyxmlNode_Get(pyobj_doc);
    elem = (xmlNodePtr) PyxmlNode_Get(pyobj_elem);

    c_retval = xmlValidateOneElement(ctxt, doc, elem);
    py_retval = libxml_intWrap((int) c_retval);
    return(py_retval);
}